

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O2

string_view absl::lts_20250127::StripTrailingAsciiWhitespace(string_view str)

{
  long in_RSI;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  reverse_iterator<const_char_*> it;
  undefined1 local_40 [8];
  reverse_iterator<const_char_*> local_38;
  reverse_iterator<const_char_*> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_38.current = (char *)(in_RDI + in_RSI);
  std::find_if_not<std::reverse_iterator<char_const*>,bool(*)(unsigned_char)>
            (&local_30,&local_38,(_func_bool_uchar *)local_40);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_28,0,(long)local_30.current - in_RSI);
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripTrailingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.rbegin(), str.rend(), absl::ascii_isspace);
  return str.substr(0, static_cast<size_t>(str.rend() - it));
}